

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

void ft_stroke_border_done(PVG_FT_StrokeBorder border)

{
  free(border->points);
  free(border->tags);
  border->num_points = 0;
  border->max_points = 0;
  border->start = -1;
  border->valid = '\0';
  return;
}

Assistant:

static void ft_stroke_border_done(PVG_FT_StrokeBorder border)
{
    free(border->points);
    free(border->tags);

    border->num_points = 0;
    border->max_points = 0;
    border->start = -1;
    border->valid = FALSE;
}